

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O0

JsErrorCode
JsDiagSetBreakOnException
          (JsRuntimeHandle runtimeHandle,JsDiagBreakOnExceptionAttributes exceptionAttributes)

{
  anon_class_16_2_54b2c60f fn;
  JsErrorCode JVar1;
  JsDiagBreakOnExceptionAttributes local_14;
  JsRuntimeHandle pvStack_10;
  JsDiagBreakOnExceptionAttributes exceptionAttributes_local;
  JsRuntimeHandle runtimeHandle_local;
  
  fn.exceptionAttributes = &local_14;
  fn.runtimeHandle = &stack0xfffffffffffffff0;
  local_14 = exceptionAttributes;
  pvStack_10 = runtimeHandle;
  JVar1 = GlobalAPIWrapper_NoRecord<JsDiagSetBreakOnException::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsDiagSetBreakOnException(
    _In_ JsRuntimeHandle runtimeHandle,
    _In_ JsDiagBreakOnExceptionAttributes exceptionAttributes)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {

        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        JsrtRuntime * runtime = JsrtRuntime::FromHandle(runtimeHandle);

        JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();

        VALIDATE_IS_DEBUGGING(jsrtDebugManager);

        jsrtDebugManager->SetBreakOnException(exceptionAttributes);

        return JsNoError;
    });
#endif
}